

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

t_float fielddesc_cvtfromcoord(_fielddesc *f,t_float coord)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  
  fVar4 = f->fd_screen1;
  fVar2 = f->fd_screen2;
  if ((fVar2 == fVar4) && (!NAN(fVar2) && !NAN(fVar4))) {
    return coord;
  }
  fVar3 = f->fd_v1;
  fVar1 = f->fd_v2;
  fVar2 = (coord - fVar4) * ((fVar1 - fVar3) / (fVar2 - fVar4)) + fVar3;
  fVar4 = f->fd_quantum;
  if ((fVar4 != 0.0) || (NAN(fVar4))) {
    fVar2 = (float)(int)(fVar2 / fVar4 + 0.5) * fVar4;
  }
  fVar4 = fVar3;
  if (fVar1 <= fVar3) {
    fVar4 = fVar1;
  }
  if (fVar4 <= fVar2) {
    fVar4 = fVar2;
  }
  if (fVar3 <= fVar1) {
    fVar3 = fVar1;
  }
  if (fVar4 <= fVar3) {
    fVar3 = fVar4;
  }
  return fVar3;
}

Assistant:

t_float fielddesc_cvtfromcoord(t_fielddesc *f, t_float coord)
{
    t_float val;
    if (f->fd_screen2 == f->fd_screen1)
        val = coord;
    else
    {
        t_float div = (f->fd_v2 - f->fd_v1)/(f->fd_screen2 - f->fd_screen1);
        t_float extreme;
        val = f->fd_v1 + (coord - f->fd_screen1) * div;
        if (f->fd_quantum != 0)
            val = ((int)((val/f->fd_quantum) + 0.5)) *  f->fd_quantum;
        extreme = (f->fd_v1 < f->fd_v2 ?
            f->fd_v1 : f->fd_v2);
        if (val < extreme) val = extreme;
        extreme = (f->fd_v1 > f->fd_v2 ?
            f->fd_v1 : f->fd_v2);
        if (val > extreme) val = extreme;
    }
    return (val);
 }